

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RiemannR.cpp
# Opt level: O1

double anon_unknown.dwarf_2c437::RiemannR_inverse<double>(double x)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar7 = 0.0;
  if (1.0 <= x) {
    if ((x < 1.0) || (2.0 <= x)) {
      if ((x < 2.0) || (3.0 <= x)) {
        dVar4 = log(x);
        dVar5 = log(dVar4);
        dVar7 = dVar4 + dVar5 * 0.5;
        if (1600.0 < x) {
          dVar7 = dVar7 + (dVar5 + -2.0) / dVar4 + dVar5 * 0.5 + -1.0;
        }
        if (1200000.0 < x) {
          dVar7 = dVar7 - (dVar5 * dVar5 + dVar5 * -6.0 + 11.0) / ((dVar4 + dVar4) * dVar4);
        }
        dVar7 = dVar7 * x;
      }
      else {
        dVar7 = 3.0;
      }
    }
    else {
      dVar7 = 2.0;
    }
    iVar1 = 9;
    dVar4 = INFINITY;
    do {
      dVar5 = RiemannR<double>(dVar7);
      dVar6 = log(dVar7);
      dVar6 = dVar6 * (dVar5 - x);
      bVar2 = iVar1 != 0;
      iVar1 = iVar1 + -1;
      uVar3 = -(ulong)(ABS(dVar4) <= ABS(dVar6));
      dVar7 = (double)(~uVar3 & (ulong)(dVar7 - dVar6) | uVar3 & (ulong)dVar7);
      if (ABS(dVar4) <= ABS(dVar6)) {
        return dVar7;
      }
      dVar4 = dVar6;
    } while (bVar2);
  }
  return dVar7;
}

Assistant:

T RiemannR_inverse(T x)
{
  if (x < 1)
    return 0;

  T t = initialNthPrimeApprox(x);
  T old_term = pstd::numeric_limits<T>::infinity();

  // The condition i < ITERS is required in case the computation
  // does not converge. This happened on Linux i386 where
  // the precision of the libc math functions is very limited.
  for (int i = 0; i < 10; i++)
  {
    // term = f(t) / f'(t)
    // f(t) = RiemannR(t) - x
    // RiemannR(t) ~ li(t), hence f'(t) = li'(t) = 1 / log(t)
    // term = (RiemannR(t) - x) / li'(t) = (RiemannR(t) - x) * log(t)
    T term = (RiemannR(t) - x) * std::log(t);

    // Not converging anymore
    if (std::abs(term) >= std::abs(old_term))
      break;

    t -= term;
    old_term = term;
  }

  return t;
}